

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

Integer compare_patches_(Integer *me,double *eps,Integer *ndim,double *array1,Integer *LO1,
                        Integer *HI1,Integer *DIMS1,double *array2,Integer *LO2,Integer *HI2,
                        Integer *DIMS2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int dims2 [7];
  int lo2 [7];
  int hi2 [7];
  int dims1 [7];
  int lo1 [7];
  int hi1 [7];
  
  uVar1 = (uint)*ndim;
  if ((int)uVar1 < 8) {
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      uVar3 = 0;
      do {
        hi1[uVar3] = (int)HI1[uVar3] + -1;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          hi2[uVar3] = (int)HI2[uVar3] + -1;
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
        if (0 < (int)uVar1) {
          uVar3 = 0;
          do {
            lo1[uVar3] = (int)LO1[uVar3] + -1;
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
          if (0 < (int)uVar1) {
            uVar3 = 0;
            do {
              lo2[uVar3] = (int)LO2[uVar3] + -1;
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
            if (0 < (int)uVar1) {
              uVar3 = 0;
              do {
                dims1[uVar3] = (int)DIMS1[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar2 != uVar3);
              if (0 < (int)uVar1) {
                uVar2 = 0;
                do {
                  dims2[uVar2] = (int)DIMS2[uVar2];
                  uVar2 = uVar2 + 1;
                } while ((uVar1 & 0x7fffffff) != uVar2);
              }
            }
          }
        }
      }
    }
    uVar1 = compare_patches_internal((int)*me,*eps,uVar1,array1,lo1,hi1,dims1,array2,lo2,hi2,dims2);
    return (ulong)uVar1;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x122,
                "Integer compare_patches_(Integer *, double *, Integer *, double *, Integer *, Integer *, Integer *, double *, Integer *, Integer *, Integer *)"
               );
}

Assistant:

Integer FATR compare_patches_(Integer *me,
                     double* eps, Integer *ndim, double *array1,    
                     Integer LO1[], Integer HI1[], Integer DIMS1[],
                     double *array2, Integer LO2[], Integer HI2[],
                     Integer DIMS2[])
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], dims1[GA_MAX_DIM]; 
int hi2[GA_MAX_DIM], lo2[GA_MAX_DIM], dims2[GA_MAX_DIM]; 

    assert((int)*ndim <= GA_MAX_DIM);

    f2c_adj_indices(HI1, hi1, (int)*ndim);
    f2c_adj_indices(HI2, hi2, (int)*ndim);
    f2c_adj_indices(LO1, lo1, (int)*ndim);
    f2c_adj_indices(LO2, lo2, (int)*ndim);
    f2c_copy_indices(DIMS1, dims1, (int)*ndim);
    f2c_copy_indices(DIMS2, dims2, (int)*ndim);

    return (Integer) compare_patches_internal((int)*me, *eps, (int)*ndim, 
                     array1, lo1, hi1, dims1, array2, lo2, hi2, dims2);
}